

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

cmBTStringRange __thiscall
cmStateDirectory::GetCompileDefinitionsEntries_abi_cxx11_(cmStateDirectory *this)

{
  PointerType pBVar1;
  PointerType pSVar2;
  cmBTStringRange cVar3;
  cmStateDirectory *this_local;
  
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&(this->Snapshot_).Position);
  cVar3 = GetPropertyContent<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,unsigned_long>
                    (&pBVar1->CompileDefinitions,pSVar2->CompileDefinitionsPosition);
  return cVar3;
}

Assistant:

cmBTStringRange cmStateDirectory::GetCompileDefinitionsEntries() const
{
  return GetPropertyContent(
    this->DirectoryState->CompileDefinitions,
    this->Snapshot_.Position->CompileDefinitionsPosition);
}